

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall soplex::SPxException::~SPxException(SPxException *this)

{
  void *in_RDI;
  
  ~SPxException((SPxException *)0x1be8a8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~SPxException() {}